

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O0

int32_t ucnv_internalConvert
                  (UConverter *outConverter,UConverter *inConverter,char *target,
                  int32_t targetCapacity,char *source,int32_t sourceLength,UErrorCode *pErrorCode)

{
  char local_c88 [8];
  char targetBuffer [1024];
  int32_t targetLength;
  char *targetLimit;
  char *sourceLimit;
  char *myTarget;
  UChar *pivot2;
  UChar *pivot;
  UChar pivotBuffer [1024];
  char *pcStack_50;
  int32_t sourceLength_local;
  char *source_local;
  char *pcStack_40;
  int32_t targetCapacity_local;
  char *target_local;
  UConverter *inConverter_local;
  UConverter *outConverter_local;
  
  targetBuffer[0x3fc] = '\0';
  targetBuffer[0x3fd] = '\0';
  targetBuffer[0x3fe] = '\0';
  targetBuffer[0x3ff] = '\0';
  pivotBuffer._2044_4_ = sourceLength;
  pcStack_50 = source;
  source_local._4_4_ = targetCapacity;
  pcStack_40 = target;
  target_local = (char *)inConverter;
  inConverter_local = outConverter;
  if (sourceLength < 0) {
    targetLimit = strchr(source,0);
  }
  else {
    targetLimit = source + sourceLength;
  }
  if (pcStack_50 == targetLimit) {
    outConverter_local._4_4_ = u_terminateChars_63(pcStack_40,source_local._4_4_,0,pErrorCode);
  }
  else {
    myTarget = (char *)&pivot;
    sourceLimit = pcStack_40;
    targetBuffer[0x3fc] = '\0';
    targetBuffer[0x3fd] = '\0';
    targetBuffer[0x3fe] = '\0';
    targetBuffer[0x3ff] = '\0';
    pivot2 = (UChar *)myTarget;
    if (0 < source_local._4_4_) {
      ucnv_convertEx_63(inConverter_local,(UConverter *)target_local,&sourceLimit,
                        pcStack_40 + source_local._4_4_,&stack0xffffffffffffffb0,targetLimit,
                        (UChar *)&pivot,&pivot2,(UChar **)&myTarget,pivotBuffer + 0x3fc,'\0','\x01',
                        pErrorCode);
      targetBuffer._1020_4_ = (int)sourceLimit - (int)pcStack_40;
    }
    if ((*pErrorCode == U_BUFFER_OVERFLOW_ERROR) || (source_local._4_4_ == 0)) {
      do {
        *pErrorCode = U_ZERO_ERROR;
        sourceLimit = local_c88;
        ucnv_convertEx_63(inConverter_local,(UConverter *)target_local,&sourceLimit,
                          targetBuffer + 0x3f8,&stack0xffffffffffffffb0,targetLimit,(UChar *)&pivot,
                          &pivot2,(UChar **)&myTarget,pivotBuffer + 0x3fc,'\0','\x01',pErrorCode);
        targetBuffer._1020_4_ = ((int)sourceLimit - (int)local_c88) + targetBuffer._1020_4_;
      } while (*pErrorCode == U_BUFFER_OVERFLOW_ERROR);
      outConverter_local._4_4_ =
           u_terminateChars_63(pcStack_40,source_local._4_4_,targetBuffer._1020_4_,pErrorCode);
    }
    else {
      outConverter_local._4_1_ = targetBuffer[0x3fc];
      outConverter_local._5_1_ = targetBuffer[0x3fd];
      outConverter_local._6_1_ = targetBuffer[0x3fe];
      outConverter_local._7_1_ = targetBuffer[0x3ff];
    }
  }
  return outConverter_local._4_4_;
}

Assistant:

static int32_t
ucnv_internalConvert(UConverter *outConverter, UConverter *inConverter,
                     char *target, int32_t targetCapacity,
                     const char *source, int32_t sourceLength,
                     UErrorCode *pErrorCode) {
    UChar pivotBuffer[CHUNK_SIZE];
    UChar *pivot, *pivot2;

    char *myTarget;
    const char *sourceLimit;
    const char *targetLimit;
    int32_t targetLength=0;

    /* set up */
    if(sourceLength<0) {
        sourceLimit=uprv_strchr(source, 0);
    } else {
        sourceLimit=source+sourceLength;
    }

    /* if there is no input data, we're done */
    if(source==sourceLimit) {
        return u_terminateChars(target, targetCapacity, 0, pErrorCode);
    }

    pivot=pivot2=pivotBuffer;
    myTarget=target;
    targetLength=0;

    if(targetCapacity>0) {
        /* perform real conversion */
        targetLimit=target+targetCapacity;
        ucnv_convertEx(outConverter, inConverter,
                       &myTarget, targetLimit,
                       &source, sourceLimit,
                       pivotBuffer, &pivot, &pivot2, pivotBuffer+CHUNK_SIZE,
                       FALSE,
                       TRUE,
                       pErrorCode);
        targetLength=(int32_t)(myTarget-target);
    }

    /*
     * If the output buffer is exhausted (or we are only "preflighting"), we need to stop writing
     * to it but continue the conversion in order to store in targetCapacity
     * the number of bytes that was required.
     */
    if(*pErrorCode==U_BUFFER_OVERFLOW_ERROR || targetCapacity==0)
    {
        char targetBuffer[CHUNK_SIZE];

        targetLimit=targetBuffer+CHUNK_SIZE;
        do {
            *pErrorCode=U_ZERO_ERROR;
            myTarget=targetBuffer;
            ucnv_convertEx(outConverter, inConverter,
                           &myTarget, targetLimit,
                           &source, sourceLimit,
                           pivotBuffer, &pivot, &pivot2, pivotBuffer+CHUNK_SIZE,
                           FALSE,
                           TRUE,
                           pErrorCode);
            targetLength+=(int32_t)(myTarget-targetBuffer);
        } while(*pErrorCode==U_BUFFER_OVERFLOW_ERROR);

        /* done with preflighting, set warnings and errors as appropriate */
        return u_terminateChars(target, targetCapacity, targetLength, pErrorCode);
    }

    /* no need to call u_terminateChars() because ucnv_convertEx() took care of that */
    return targetLength;
}